

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<long_long>>
               (GetterXsYs<long_long> getter,TransformerLogLog transformer,ImDrawList *DrawList,
               ImPlotMarker marker,float size,bool rend_mk_line,ImU32 col_mk_line,float weight,
               bool rend_mk_fill,ImU32 col_mk_fill)

{
  ImPlotPlot *pIVar1;
  ImPlotContext *pIVar2;
  long lVar3;
  int iVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  ImVec2 c;
  ImVec2 local_98;
  uint local_8c;
  uint local_88;
  float local_84;
  ImU32 local_80;
  float local_7c;
  long local_78;
  ImDrawList *local_70;
  long local_68;
  ulong local_60;
  longlong *local_58;
  longlong *local_50;
  ImPlotContext *local_48;
  double local_40;
  double local_38;
  
  if (0 < getter.Count) {
    local_48 = GImPlot;
    local_50 = getter.Xs;
    local_58 = getter.Ys;
    local_60 = (ulong)(uint)getter.Offset;
    local_68 = (long)getter.Stride;
    local_78 = (long)marker;
    iVar4 = 0;
    local_88 = (uint)rend_mk_line;
    local_8c = (uint)rend_mk_fill;
    local_84 = size;
    local_80 = col_mk_line;
    local_7c = weight;
    local_70 = DrawList;
    do {
      pIVar2 = GImPlot;
      lVar3 = ((((int)local_60 + iVar4) % getter.Count + getter.Count) % getter.Count) * local_68;
      local_38 = (double)*(long *)((long)local_58 + lVar3);
      dVar6 = log10((double)*(long *)((long)local_50 + lVar3) /
                    (GImPlot->CurrentPlot->XAxis).Range.Min);
      pIVar1 = pIVar2->CurrentPlot;
      local_40 = (pIVar1->XAxis).Range.Min;
      local_40 = (double)(float)(dVar6 / pIVar2->LogDenX) * ((pIVar1->XAxis).Range.Max - local_40) +
                 local_40;
      dVar7 = log10(local_38 / pIVar1->YAxis[transformer.YAxis].Range.Min);
      pIVar1 = pIVar2->CurrentPlot;
      dVar6 = pIVar1->YAxis[transformer.YAxis].Range.Min;
      local_98.x = (float)((local_40 - (pIVar1->XAxis).Range.Min) * pIVar2->Mx +
                          (double)pIVar2->PixelRange[transformer.YAxis].Min.x);
      fVar5 = (float)((((double)(float)(dVar7 / pIVar2->LogDenY[transformer.YAxis]) *
                        (pIVar1->YAxis[transformer.YAxis].Range.Max - dVar6) + dVar6) - dVar6) *
                      pIVar2->My[transformer.YAxis] +
                     (double)pIVar2->PixelRange[transformer.YAxis].Min.y);
      local_98.y = fVar5;
      pIVar1 = local_48->CurrentPlot;
      if (((((pIVar1->PlotRect).Min.x <= local_98.x) && ((pIVar1->PlotRect).Min.y <= fVar5)) &&
          (local_98.x < (pIVar1->PlotRect).Max.x)) && (fVar5 < (pIVar1->PlotRect).Max.y)) {
        (*RenderMarkers<ImPlot::TransformerLogLog,_ImPlot::GetterXsYs<long_long>_>::marker_table
          [local_78])(local_70,&local_98,local_84,SUB41(local_88,0),local_80,SUB41(local_8c,0),
                      col_mk_fill,local_7c);
      }
      iVar4 = iVar4 + 1;
    } while (getter.Count != iVar4);
  }
  return;
}

Assistant:

inline void RenderMarkers(Getter getter, Transformer transformer, ImDrawList& DrawList, ImPlotMarker marker, float size, bool rend_mk_line, ImU32 col_mk_line, float weight, bool rend_mk_fill, ImU32 col_mk_fill) {
    static void (*marker_table[ImPlotMarker_COUNT])(ImDrawList&, const ImVec2&, float s, bool, ImU32, bool, ImU32, float) = {
        RenderMarkerCircle,
        RenderMarkerSquare,
        RenderMarkerDiamond ,
        RenderMarkerUp ,
        RenderMarkerDown ,
        RenderMarkerLeft,
        RenderMarkerRight,
        RenderMarkerCross,
        RenderMarkerPlus,
        RenderMarkerAsterisk
    };
    ImPlotContext& gp = *GImPlot;
    for (int i = 0; i < getter.Count; ++i) {
        ImVec2 c = transformer(getter(i));
        if (gp.CurrentPlot->PlotRect.Contains(c))
            marker_table[marker](DrawList, c, size, rend_mk_line, col_mk_line, rend_mk_fill, col_mk_fill, weight);
    }
}